

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

string * generateContainerId_abi_cxx11_(string *__return_storage_ptr__,size_t length)

{
  uint uVar1;
  ulong uVar2;
  size_t __i;
  long lVar3;
  undefined1 local_2750 [8];
  random_device rd;
  mt19937 gen;
  uniform_int_distribution<int> pick;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  std::random_device::random_device((random_device *)local_2750);
  uVar1 = std::random_device::_M_getval();
  rd.field_0._M_mt._M_p = (size_t)uVar1;
  lVar3 = 1;
  uVar2 = rd.field_0._M_mt._M_p;
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
    gen._M_x[lVar3 + -1] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  gen._M_x[0x26f] = 0x270;
  gen._M_p = 0x2300000000;
  if (length != 0) {
    do {
      std::uniform_int_distribution<int>::operator()
                ((uniform_int_distribution<int> *)&gen._M_p,
                 (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  *)((long)&rd.field_0 + 0x1380),(param_type *)&gen._M_p);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      length = length - 1;
    } while (length != 0);
  }
  std::random_device::_M_fini();
  return __return_storage_ptr__;
}

Assistant:

std::string generateContainerId(size_t length)
{
    std::string randomId;
    randomId.reserve(length);

    static const char charset[] =
            "0123456789"
            "abcdefghijklmnopqrstuvwxyz";

    std::random_device rd;  // Will be used to obtain a seed for the random number engine
    std::mt19937 gen(rd()); // Standard mersenne_twister_engine seeded with rd()
    std::uniform_int_distribution<> pick(0, sizeof(charset) - 2);

    for (int i = 0; i < length; i++)
        randomId += charset[pick(gen)];

    return randomId;
}